

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,Type *params,char **params_1,StringPtr *params_2,
          char **params_3,StringPtr *params_4,char **params_5,String *params_6,String *params_7,
          char (*params_8) [2])

{
  Type *value;
  char **ppcVar1;
  StringPtr *pSVar2;
  String *pSVar3;
  char (*value_00) [2];
  ArrayPtr<const_char> *in_stack_ffffffffffffff18;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  NoInfer<kj::StringPtr> *local_40;
  StringPtr *params_local_4;
  char **params_local_3;
  StringPtr *params_local_2;
  char **params_local_1;
  Type *params_local;
  
  local_40 = (NoInfer<kj::StringPtr> *)params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (char **)this;
  params_local = (Type *)__return_storage_ptr__;
  value = fwd<kj::Exception::Type>((NoInfer<kj::Exception::Type> *)this);
  local_50 = (ArrayPtr<const_char>)toCharSequence<kj::Exception::Type>(value);
  ppcVar1 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_2);
  local_60 = toCharSequence<char_const*>(ppcVar1);
  pSVar2 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_3);
  local_70 = toCharSequence<kj::StringPtr>(pSVar2);
  ppcVar1 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_4);
  local_80 = toCharSequence<char_const*>(ppcVar1);
  pSVar2 = fwd<kj::StringPtr>(local_40);
  local_90 = toCharSequence<kj::StringPtr>(pSVar2);
  ppcVar1 = fwd<char_const*>((NoInfer<const_char_*> *)params_4);
  local_a0 = toCharSequence<char_const*>(ppcVar1);
  pSVar3 = fwd<kj::String>((NoInfer<kj::String> *)params_5);
  local_b0 = toCharSequence<kj::String>(pSVar3);
  pSVar3 = fwd<kj::String>(params_6);
  local_c0 = toCharSequence<kj::String>(pSVar3);
  value_00 = ::const((char (*) [2])params_7);
  local_d0 = toCharSequence<char_const(&)[2]>(value_00);
  _::
  concat<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,(StringPtr *)&local_60,&local_70,&local_80,
             &local_90,&local_a0,&local_b0,&local_c0,&local_d0,in_stack_ffffffffffffff18);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}